

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrsolv.c
# Opt level: O0

int qrsolv_cvkit(integer *n,doublereal *r__,integer *ldr,integer *ipvt,doublereal *diag,
                doublereal *qtb,doublereal *x,doublereal *sdiag,doublereal *wa)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  doublereal dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  double dVar10;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  doublereal sum;
  doublereal sin__;
  doublereal cos__;
  doublereal tan__;
  integer kp1;
  integer jp1;
  doublereal qtbpj;
  integer nsing;
  doublereal cotan;
  integer l;
  integer k;
  integer j;
  integer i__;
  doublereal temp;
  doublereal d__2;
  doublereal d__1;
  integer i__3;
  integer i__2;
  integer i__1;
  integer r_offset;
  integer r_dim1;
  double local_f0;
  double local_e0;
  doublereal local_d8;
  double local_d0;
  double local_c8;
  doublereal local_a8;
  long local_a0;
  long local_88;
  long local_80;
  long local_78;
  
  in_stack_00000018 = in_stack_00000018 + -8;
  lVar6 = in_stack_00000010 + -8;
  lVar7 = in_stack_00000008 + -8;
  lVar2 = *in_RDX;
  lVar8 = in_RSI + (lVar2 + 1) * -8;
  lVar9 = *in_RDI;
  for (local_80 = 1; local_80 <= lVar9; local_80 = local_80 + 1) {
    lVar3 = *in_RDI;
    for (local_78 = local_80; local_78 <= lVar3; local_78 = local_78 + 1) {
      *(undefined8 *)(lVar8 + (local_78 + local_80 * lVar2) * 8) =
           *(undefined8 *)(lVar8 + (local_80 + local_78 * lVar2) * 8);
    }
    *(undefined8 *)(lVar7 + local_80 * 8) =
         *(undefined8 *)(lVar8 + (local_80 + local_80 * lVar2) * 8);
    *(undefined8 *)(in_stack_00000018 + local_80 * 8) = *(undefined8 *)(in_R9 + -8 + local_80 * 8);
  }
  lVar9 = *in_RDI;
  for (local_80 = 1; local_80 <= lVar9; local_80 = local_80 + 1) {
    lVar3 = *(long *)(in_RCX + -8 + local_80 * 8);
    dVar10 = *(double *)(in_R8 + -8 + lVar3 * 8);
    if ((dVar10 != qrsolv_cvkit::zero) || (NAN(dVar10) || NAN(qrsolv_cvkit::zero))) {
      lVar4 = *in_RDI;
      for (local_88 = local_80; local_88 <= lVar4; local_88 = local_88 + 1) {
        *(doublereal *)(lVar6 + local_88 * 8) = qrsolv_cvkit::zero;
      }
      *(undefined8 *)(lVar6 + local_80 * 8) = *(undefined8 *)(in_R8 + -8 + lVar3 * 8);
      local_a8 = qrsolv_cvkit::zero;
      lVar3 = *in_RDI;
      for (local_88 = local_80; dVar5 = qrsolv_cvkit::p5, local_88 <= lVar3; local_88 = local_88 + 1
          ) {
        dVar10 = *(double *)(lVar6 + local_88 * 8);
        if ((dVar10 != qrsolv_cvkit::zero) || (NAN(dVar10) || NAN(qrsolv_cvkit::zero))) {
          local_e0 = *(double *)(lVar8 + (local_88 + local_88 * lVar2) * 8);
          if (local_e0 < 0.0) {
            local_e0 = -local_e0;
          }
          local_f0 = *(double *)(lVar6 + local_88 * 8);
          if (local_f0 < 0.0) {
            local_f0 = -local_f0;
          }
          if (local_e0 < local_f0) {
            local_c8 = *(double *)(lVar8 + (local_88 + local_88 * lVar2) * 8) /
                       *(double *)(lVar6 + local_88 * 8);
            local_d0 = sqrt(qrsolv_cvkit::p25 * local_c8 * local_c8 + qrsolv_cvkit::p25);
            local_d0 = dVar5 / local_d0;
            local_c8 = local_d0 * local_c8;
          }
          else {
            local_d0 = *(double *)(lVar6 + local_88 * 8) /
                       *(double *)(lVar8 + (local_88 + local_88 * lVar2) * 8);
            local_c8 = sqrt(qrsolv_cvkit::p25 * local_d0 * local_d0 + qrsolv_cvkit::p25);
            local_c8 = dVar5 / local_c8;
            local_d0 = local_c8 * local_d0;
          }
          *(double *)(lVar8 + (local_88 + local_88 * lVar2) * 8) =
               local_c8 * *(double *)(lVar8 + (local_88 + local_88 * lVar2) * 8) +
               local_d0 * *(double *)(lVar6 + local_88 * 8);
          dVar10 = local_d0 * local_a8;
          local_a8 = -local_d0 * *(double *)(in_stack_00000018 + local_88 * 8) + local_c8 * local_a8
          ;
          *(double *)(in_stack_00000018 + local_88 * 8) =
               local_c8 * *(double *)(in_stack_00000018 + local_88 * 8) + dVar10;
          local_78 = local_88 + 1;
          if (local_78 <= *in_RDI) {
            lVar4 = *in_RDI;
            for (; local_78 <= lVar4; local_78 = local_78 + 1) {
              dVar10 = *(double *)(lVar8 + (local_78 + local_88 * lVar2) * 8);
              dVar1 = *(double *)(lVar6 + local_78 * 8);
              *(double *)(lVar6 + local_78 * 8) =
                   -local_d0 * *(double *)(lVar8 + (local_78 + local_88 * lVar2) * 8) +
                   local_c8 * *(double *)(lVar6 + local_78 * 8);
              *(double *)(lVar8 + (local_78 + local_88 * lVar2) * 8) =
                   local_c8 * dVar10 + local_d0 * dVar1;
            }
          }
        }
      }
    }
    *(undefined8 *)(lVar6 + local_80 * 8) =
         *(undefined8 *)(lVar8 + (local_80 + local_80 * lVar2) * 8);
    *(undefined8 *)(lVar8 + (local_80 + local_80 * lVar2) * 8) =
         *(undefined8 *)(lVar7 + local_80 * 8);
  }
  local_a0 = *in_RDI;
  lVar9 = *in_RDI;
  for (local_80 = 1; local_80 <= lVar9; local_80 = local_80 + 1) {
    dVar10 = *(double *)(lVar6 + local_80 * 8);
    if (((dVar10 == qrsolv_cvkit::zero) && (!NAN(dVar10) && !NAN(qrsolv_cvkit::zero))) &&
       (local_a0 == *in_RDI)) {
      local_a0 = local_80 + -1;
    }
    if (local_a0 < *in_RDI) {
      *(doublereal *)(in_stack_00000018 + local_80 * 8) = qrsolv_cvkit::zero;
    }
  }
  if (0 < local_a0) {
    for (local_88 = 1; local_88 <= local_a0; local_88 = local_88 + 1) {
      lVar9 = (local_a0 - local_88) + 1;
      local_d8 = qrsolv_cvkit::zero;
      local_78 = (local_a0 - local_88) + 2;
      if (local_78 <= local_a0) {
        for (; local_78 <= local_a0; local_78 = local_78 + 1) {
          local_d8 = *(double *)(lVar8 + (local_78 + lVar9 * lVar2) * 8) *
                     *(double *)(in_stack_00000018 + local_78 * 8) + local_d8;
        }
      }
      *(double *)(in_stack_00000018 + lVar9 * 8) =
           (*(double *)(in_stack_00000018 + lVar9 * 8) - local_d8) / *(double *)(lVar6 + lVar9 * 8);
    }
  }
  lVar2 = *in_RDI;
  for (local_80 = 1; local_80 <= lVar2; local_80 = local_80 + 1) {
    *(undefined8 *)(lVar7 + *(long *)(in_RCX + -8 + local_80 * 8) * 8) =
         *(undefined8 *)(in_stack_00000018 + local_80 * 8);
  }
  return 0;
}

Assistant:

int qrsolv_cvkit(integer *n, doublereal *r__, integer *ldr,
	integer *ipvt, doublereal *diag, doublereal *qtb, doublereal *x,
	doublereal *sdiag, doublereal *wa)
{
    /* Initialized data */

    static doublereal p5 = .5;
    static doublereal p25 = .25;
    static doublereal zero = 0.;

    /* System generated locals */
    integer r_dim1, r_offset, i__1, i__2, i__3;
    doublereal d__1, d__2;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    doublereal temp;
    integer i__, j, k, l;
    doublereal cotan;
    integer nsing;
    doublereal qtbpj;
    integer jp1, kp1;
    doublereal tan__, cos__, sin__, sum;

/*<       integer n,ldr >*/
/*<       integer ipvt(n) >*/
/*<       double precision r(ldr,n),diag(n),qtb(n),x(n),sdiag(n),wa(n) >*/
/*     ********** */

/*     subroutine qrsolv */

/*     given an m by n matrix a, an n by n diagonal matrix d, */
/*     and an m-vector b, the problem is to determine an x which */
/*     solves the system */

/*           a*x = b ,     d*x = 0 , */

/*     in the least squares sense. */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization, with column pivoting, of a. that is, if */
/*     a*p = q*r, where p is a permutation matrix, q has orthogonal */
/*     columns, and r is an upper triangular matrix with diagonal */
/*     elements of nonincreasing magnitude, then qrsolv expects */
/*     the full upper triangle of r, the permutation matrix p, */
/*     and the first n components of (q transpose)*b. the system */
/*     a*x = b, d*x = 0, is then equivalent to */

/*                  t       t */
/*           r*z = q *b ,  p *d*p*z = 0 , */

/*     where x = p*z. if this system does not have full rank, */
/*     then a least squares solution is obtained. on output qrsolv */
/*     also provides an upper triangular matrix s such that */

/*            t   t               t */
/*           p *(a *a + d*d)*p = s *s . */

/*     s is computed within qrsolv and may be of separate interest. */

/*     the subroutine statement is */

/*       subroutine qrsolv(n,r,ldr,ipvt,diag,qtb,x,sdiag,wa) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an n by n array. on input the full upper triangle */
/*         must contain the full upper triangle of the matrix r. */
/*         on output the full upper triangle is unaltered, and the */
/*         strict lower triangle contains the strict upper triangle */
/*         (transposed) of the upper triangular matrix s. */

/*       ldr is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array r. */

/*       ipvt is an integer input array of length n which defines the */
/*         permutation matrix p such that a*p = q*r. column j of p */
/*         is column ipvt(j) of the identity matrix. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       x is an output array of length n which contains the least */
/*         squares solution of the system a*x = b, d*x = 0. */

/*       sdiag is an output array of length n which contains the */
/*         diagonal elements of the upper triangular matrix s. */

/*       wa is a work array of length n. */

/*     subprograms called */

/*       fortran-supplied ... dabs,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,j,jp1,k,kp1,l,nsing >*/
/*<       double precision cos,cotan,p5,p25,qtbpj,sin,sum,tan,temp,zero >*/
/*<       data p5,p25,zero /5.0d-1,2.5d-1,0.0d0/ >*/
    /* Parameter adjustments */
    --wa;
    --sdiag;
    --x;
    --qtb;
    --diag;
    --ipvt;
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1 * 1;
    r__ -= r_offset;

    /* Function Body */

/*     copy r and (q transpose)*b to preserve input and initialize s. */
/*     in particular, save the diagonal elements of r in x. */

/*<       do 20 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          do 10 i = j, n >*/
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<             r(i,j) = r(j,i) >*/
	    r__[i__ + j * r_dim1] = r__[j + i__ * r_dim1];
/*<    10       continue >*/
/* L10: */
	}
/*<          x(j) = r(j,j) >*/
	x[j] = r__[j + j * r_dim1];
/*<          wa(j) = qtb(j) >*/
	wa[j] = qtb[j];
/*<    20    continue >*/
/* L20: */
    }

/*     eliminate the diagonal matrix d using a givens rotation. */

/*<       do 100 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {

/*        prepare the row of d to be eliminated, locating the */
/*        diagonal element using p from the qr factorization. */

/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          if (diag(l) .eq. zero) go to 90 >*/
	if (diag[l] == zero) {
	    goto L90;
	}
/*<          do 30 k = j, n >*/
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
/*<             sdiag(k) = zero >*/
	    sdiag[k] = zero;
/*<    30       continue >*/
/* L30: */
	}
/*<          sdiag(j) = diag(l) >*/
	sdiag[j] = diag[l];

/*        the transformations to eliminate the row of d */
/*        modify only a single element of (q transpose)*b */
/*        beyond the first n, which is initially zero. */

/*<          qtbpj = zero >*/
	qtbpj = zero;
/*<          do 80 k = j, n >*/
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {

/*           determine a givens rotation which eliminates the */
/*           appropriate element in the current row of d. */

/*<             if (sdiag(k) .eq. zero) go to 70 >*/
	    if (sdiag[k] == zero) {
		goto L70;
	    }
/*<             if (dabs(r(k,k)) .ge. dabs(sdiag(k))) go to 40 >*/
	    if ((d__1 = r__[k + k * r_dim1], abs(d__1)) >= (d__2 = sdiag[k],
		    abs(d__2))) {
		goto L40;
	    }
/*<                cotan = r(k,k)/sdiag(k) >*/
	    cotan = r__[k + k * r_dim1] / sdiag[k];
/*<                sin = p5/dsqrt(p25+p25*cotan**2) >*/
/* Computing 2nd power */
	    d__1 = cotan;
	    sin__ = p5 / sqrt(p25 + p25 * (d__1 * d__1));
/*<                cos = sin*cotan >*/
	    cos__ = sin__ * cotan;
/*<                go to 50 >*/
	    goto L50;
/*<    40       continue >*/
L40:
/*<                tan = sdiag(k)/r(k,k) >*/
	    tan__ = sdiag[k] / r__[k + k * r_dim1];
/*<                cos = p5/dsqrt(p25+p25*tan**2) >*/
/* Computing 2nd power */
	    d__1 = tan__;
	    cos__ = p5 / sqrt(p25 + p25 * (d__1 * d__1));
/*<                sin = cos*tan >*/
	    sin__ = cos__ * tan__;
/*<    50       continue >*/
L50:

/*           compute the modified diagonal element of r and */
/*           the modified element of ((q transpose)*b,0). */

/*<             r(k,k) = cos*r(k,k) + sin*sdiag(k) >*/
	    r__[k + k * r_dim1] = cos__ * r__[k + k * r_dim1] + sin__ * sdiag[
		    k];
/*<             temp = cos*wa(k) + sin*qtbpj >*/
	    temp = cos__ * wa[k] + sin__ * qtbpj;
/*<             qtbpj = -sin*wa(k) + cos*qtbpj >*/
	    qtbpj = -sin__ * wa[k] + cos__ * qtbpj;
/*<             wa(k) = temp >*/
	    wa[k] = temp;

/*           accumulate the tranformation in the row of s. */

/*<             kp1 = k + 1 >*/
	    kp1 = k + 1;
/*<             if (n .lt. kp1) go to 70 >*/
	    if (*n < kp1) {
		goto L70;
	    }
/*<             do 60 i = kp1, n >*/
	    i__3 = *n;
	    for (i__ = kp1; i__ <= i__3; ++i__) {
/*<                temp = cos*r(i,k) + sin*sdiag(i) >*/
		temp = cos__ * r__[i__ + k * r_dim1] + sin__ * sdiag[i__];
/*<                sdiag(i) = -sin*r(i,k) + cos*sdiag(i) >*/
		sdiag[i__] = -sin__ * r__[i__ + k * r_dim1] + cos__ * sdiag[
			i__];
/*<                r(i,k) = temp >*/
		r__[i__ + k * r_dim1] = temp;
/*<    60          continue >*/
/* L60: */
	    }
/*<    70       continue >*/
L70:
/*<    80       continue >*/
/* L80: */
	    ;
	}
/*<    90    continue >*/
L90:

/*        store the diagonal element of s and restore */
/*        the corresponding diagonal element of r. */

/*<          sdiag(j) = r(j,j) >*/
	sdiag[j] = r__[j + j * r_dim1];
/*<          r(j,j) = x(j) >*/
	r__[j + j * r_dim1] = x[j];
/*<   100    continue >*/
/* L100: */
    }

/*     solve the triangular system for z. if the system is */
/*     singular, then obtain a least squares solution. */

/*<       nsing = n >*/
    nsing = *n;
/*<       do 110 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          if (sdiag(j) .eq. zero .and. nsing .eq. n) nsing = j - 1 >*/
	if (sdiag[j] == zero && nsing == *n) {
	    nsing = j - 1;
	}
/*<          if (nsing .lt. n) wa(j) = zero >*/
	if (nsing < *n) {
	    wa[j] = zero;
	}
/*<   110    continue >*/
/* L110: */
    }
/*<       if (nsing .lt. 1) go to 150 >*/
    if (nsing < 1) {
	goto L150;
    }
/*<       do 140 k = 1, nsing >*/
    i__1 = nsing;
    for (k = 1; k <= i__1; ++k) {
/*<          j = nsing - k + 1 >*/
	j = nsing - k + 1;
/*<          sum = zero >*/
	sum = zero;
/*<          jp1 = j + 1 >*/
	jp1 = j + 1;
/*<          if (nsing .lt. jp1) go to 130 >*/
	if (nsing < jp1) {
	    goto L130;
	}
/*<          do 120 i = jp1, nsing >*/
	i__2 = nsing;
	for (i__ = jp1; i__ <= i__2; ++i__) {
/*<             sum = sum + r(i,j)*wa(i) >*/
	    sum += r__[i__ + j * r_dim1] * wa[i__];
/*<   120       continue >*/
/* L120: */
	}
/*<   130    continue >*/
L130:
/*<          wa(j) = (wa(j) - sum)/sdiag(j) >*/
	wa[j] = (wa[j] - sum) / sdiag[j];
/*<   140    continue >*/
/* L140: */
    }
/*<   150 continue >*/
L150:

/*     permute the components of z back to components of x. */

/*<       do 160 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          x(l) = wa(j) >*/
	x[l] = wa[j];
/*<   160    continue >*/
/* L160: */
    }
/*<       return >*/
    return 0;

/*     last card of subroutine qrsolv. */

/*<       end >*/
}